

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::getShaderBody
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,STAGES stage,
          string *out_assignments,string *out_calculations)

{
  char *pcVar1;
  GLchar *text;
  string *this_00;
  bool *__s;
  Type local_38;
  
  std::__cxx11::string::_M_replace
            ((ulong)out_calculations,0,(char *)out_calculations->_M_string_length,0x1aee929);
  pcVar1 = 
  "    vegeta = uni_vegeta;\n    trunks = uni_trunks;\n    goku   = uni_goku;\n    gohan  = uni_gohan;\n"
  ;
  if (stage != GEOMETRY) {
    pcVar1 = glcts::fixed_sample_locations_values + 1;
  }
  __s = (bool *)
        "    fs_out = vec4(0);\n    if (TYPE(1) == gohan + goku + trunks + vegeta)\n    {\n        fs_out = vec4(1);\n    }\n"
  ;
  if (stage != FRAGMENT) {
    __s = (bool *)pcVar1;
  }
  pcVar1 = (char *)out_assignments->_M_string_length;
  strlen(__s);
  this_00 = out_assignments;
  std::__cxx11::string::_M_replace((ulong)out_assignments,0,pcVar1,(ulong)__s);
  if (stage == FRAGMENT) {
    local_38 = TestBase::getType((TestBase *)this_00,test_case_index);
    text = Utils::Type::GetGLSLTypeName(&local_38);
    Utils::replaceAllTokens("TYPE",text,out_assignments);
  }
  return;
}

Assistant:

void XFBOverrideQualifiersWithAPITest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage,
													 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* gs = "    vegeta = uni_vegeta;\n"
							  "    trunks = uni_trunks;\n"
							  "    goku   = uni_goku;\n"
							  "    gohan  = uni_gohan;\n";
	static const GLchar* fs = "    fs_out = vec4(0);\n"
							  "    if (TYPE(1) == gohan + goku + trunks + vegeta)\n"
							  "    {\n"
							  "        fs_out = vec4(1);\n"
							  "    }\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;

	if (Utils::Shader::FRAGMENT == stage)
	{
		const Utils::Type& type = getType(test_case_index);

		Utils::replaceAllTokens("TYPE", type.GetGLSLTypeName(), out_assignments);
	}
}